

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_math.c
# Opt level: O0

sunrealtype SUNRpowerI(sunrealtype base,int exponent)

{
  int iVar1;
  sunrealtype prod;
  int expt;
  int i;
  int exponent_local;
  sunrealtype base_local;
  
  prod = 1.0;
  iVar1 = exponent;
  if (exponent < 1) {
    iVar1 = -exponent;
  }
  for (i = 1; i <= iVar1; i = i + 1) {
    prod = base * prod;
  }
  if (exponent < 0) {
    prod = 1.0 / prod;
  }
  return prod;
}

Assistant:

sunrealtype SUNRpowerI(sunrealtype base, int exponent)
{
  int i, expt;
  sunrealtype prod;

  prod = SUN_RCONST(1.0);
  expt = abs(exponent);
  for (i = 1; i <= expt; i++) { prod *= base; }
  if (exponent < 0) { prod = SUN_RCONST(1.0) / prod; }
  return (prod);
}